

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O1

void __thiscall
fmp4_stream::media_fragment::patch_tfdt(media_fragment *this,uint64_t patch,uint32_t seq_nr)

{
  uint64_t *puVar1;
  uchar uVar2;
  uchar uVar3;
  uchar uVar4;
  uchar uVar5;
  ulong uVar6;
  bool bVar7;
  uint uVar8;
  pointer puVar9;
  ulong uVar10;
  ulong uVar11;
  long local_e0;
  long *local_d0 [2];
  long local_c0 [2];
  long *local_b0 [2];
  long local_a0 [2];
  long *local_90 [2];
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  if ((this->moof_box_).size_ != 0) {
    if (seq_nr != 0) {
      *(uint32_t *)&(this->mfhd_).super_full_box.field_0x6c = seq_nr;
    }
    puVar1 = &(this->tfdt_).base_media_decode_time_;
    *puVar1 = *puVar1 + patch;
    puVar9 = (this->moof_box_).box_data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (8 < (ulong)((long)(this->moof_box_).box_data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)puVar9)) {
      uVar11 = 8;
      do {
        uVar8 = *(uint *)(puVar9 + uVar11);
        if (uVar8 == 0x1000000) {
          uVar10 = *(ulong *)(puVar9 + uVar11 + 8);
          uVar10 = uVar10 >> 0x38 | (uVar10 & 0xff000000000000) >> 0x28 |
                   (uVar10 & 0xff0000000000) >> 0x18 | (uVar10 & 0xff00000000) >> 8 |
                   (uVar10 & 0xff000000) << 8 | (uVar10 & 0xff0000) << 0x18 |
                   (uVar10 & 0xff00) << 0x28 | uVar10 << 0x38;
          local_e0 = 8;
        }
        else {
          uVar10 = (ulong)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                          uVar8 << 0x18);
          local_e0 = 0;
        }
        uVar2 = puVar9[uVar11 + 4];
        uVar3 = puVar9[uVar11 + 5];
        uVar4 = puVar9[uVar11 + 6];
        uVar5 = puVar9[uVar11 + 7];
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"mfhd","");
        if ((((uVar2 != (uchar)*local_50[0]) || (uVar3 != *(uchar *)((long)local_50[0] + 1))) ||
            (uVar4 != *(uchar *)((long)local_50[0] + 2))) ||
           (bVar7 = true, uVar5 != *(uchar *)((long)local_50[0] + 3))) {
          bVar7 = false;
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        if (bVar7) {
          if (seq_nr != 0) {
            *(uint32_t *)(puVar9 + local_e0 + uVar11 + 0xc) =
                 seq_nr >> 0x18 | (seq_nr & 0xff0000) >> 8 | (seq_nr & 0xff00) << 8 | seq_nr << 0x18
            ;
          }
        }
        else {
          local_70[0] = local_60;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"trun","");
          if (((uVar2 != (uchar)*local_70[0]) || (uVar3 != *(uchar *)((long)local_70[0] + 1))) ||
             ((uVar4 != *(uchar *)((long)local_70[0] + 2) ||
              (bVar7 = true, uVar5 != *(uchar *)((long)local_70[0] + 3))))) {
            bVar7 = false;
          }
          if (local_70[0] != local_60) {
            operator_delete(local_70[0],local_60[0] + 1);
          }
          if (!bVar7) {
            local_90[0] = local_80;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"tfdt","");
            if (((uVar2 != (uchar)*local_90[0]) || (uVar3 != *(uchar *)((long)local_90[0] + 1))) ||
               ((uVar4 != *(uchar *)((long)local_90[0] + 2) ||
                (bVar7 = true, uVar5 != *(uchar *)((long)local_90[0] + 3))))) {
              bVar7 = false;
            }
            if (local_90[0] != local_80) {
              operator_delete(local_90[0],local_80[0] + 1);
            }
            if (bVar7) {
              uVar6 = (this->tfdt_).base_media_decode_time_;
              if ((this->tfdt_).super_full_box.super_box.field_0x62 == '\0') {
                uVar8 = (uint)uVar6;
                *(uint *)(puVar9 + local_e0 + uVar11 + 0xc) =
                     uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18
                ;
              }
              else {
                *(ulong *)(puVar9 + local_e0 + uVar11 + 0xc) =
                     uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 |
                     (uVar6 & 0xff0000000000) >> 0x18 | (uVar6 & 0xff00000000) >> 8 |
                     (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 |
                     (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38;
              }
            }
            else {
              local_b0[0] = local_a0;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"tfhd","");
              if ((((uVar2 != (uchar)*local_b0[0]) || (uVar3 != *(uchar *)((long)local_b0[0] + 1)))
                  || (uVar4 != *(uchar *)((long)local_b0[0] + 2))) ||
                 (bVar7 = true, uVar5 != *(uchar *)((long)local_b0[0] + 3))) {
                bVar7 = false;
              }
              if (local_b0[0] != local_a0) {
                operator_delete(local_b0[0],local_a0[0] + 1);
              }
              if (!bVar7) {
                local_d0[0] = local_c0;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"traf","");
                if (((uVar2 != (uchar)*local_d0[0]) || (uVar3 != *(uchar *)((long)local_d0[0] + 1)))
                   || ((uVar4 != *(uchar *)((long)local_d0[0] + 2) ||
                       (bVar7 = true, uVar5 != *(uchar *)((long)local_d0[0] + 3))))) {
                  bVar7 = false;
                }
                if (local_d0[0] != local_c0) {
                  operator_delete(local_d0[0],local_c0[0] + 1);
                }
                uVar10 = uVar10 & 0xffffffff;
                if (bVar7) {
                  uVar10 = 8;
                }
              }
            }
          }
        }
        uVar11 = uVar11 + uVar10;
        puVar9 = (this->moof_box_).box_data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
      } while (uVar11 < (ulong)((long)(this->moof_box_).box_data_.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar9));
    }
  }
  return;
}

Assistant:

void media_fragment::patch_tfdt(uint64_t patch, uint32_t seq_nr)
	{
		if (!moof_box_.size_)
			return;

		uint64_t box_size = 0;
		uint64_t offset = 8;

		if (seq_nr)
			this->mfhd_.seq_nr_ = seq_nr;

		this->tfdt_.base_media_decode_time_ = \
			this->tfdt_.base_media_decode_time_ + patch;

		// find the tfdt box and overwrite it
		while (moof_box_.box_data_.size() > offset)
		{
			unsigned int temp_off = 0;
			box_size = (uint64_t)fmp4_read_uint32((char *)&moof_box_.box_data_[offset]);
			uint8_t * ptr = &moof_box_.box_data_[0];
			char name[5] = { (char)ptr[offset + 4],(char)ptr[offset + 5],(char)ptr[offset + 6],(char)ptr[offset + 7],'\0' };

			if (box_size == 1) // the box_size is a large size (should not happen in fmp4)
			{
				temp_off = 8;
				box_size = fmp4_read_uint64((char *)& ptr[offset + temp_off]);
			}

			if (f_compare_4cc(name, "mfhd"))
			{
				
				if (seq_nr) 
					fmp4_write_uint32(seq_nr, (char *)&ptr[offset + temp_off + 12]);
				//mfhd_.parse((char *)& ptr[offset + temp_off]);
				offset += (uint64_t)box_size;
				//cout << "mfhd size" << box_size << endl;
				continue;
			}

			if (f_compare_4cc(name, "trun"))
			{
				//trun_.parse((char *)& ptr[offset + temp_off]);
				offset += (uint64_t)box_size;
				continue;
			}

			if (f_compare_4cc(name, "tfdt"))
			{
				
				this->tfdt_.version_ ? \
					fmp4_write_uint64(this->tfdt_.base_media_decode_time_, (char *)&ptr[offset + temp_off + 12]) : \
					fmp4_write_uint32((uint32_t)this->tfdt_.base_media_decode_time_, (char *)&ptr[offset + temp_off + 12]);

				offset += (uint64_t)box_size;
				continue;
			}

			if (f_compare_4cc(name, "tfhd"))
			{
				//tfhd_.parse((char *)& ptr[offset + temp_off]);
				offset += (uint64_t)box_size;
				continue;
			}

			// cmaf style only one traf box per moof so we skip it
			if (f_compare_4cc(name, "traf"))
			{
				offset += 8;
			}
			else
				offset += (unsigned int)box_size;
		}
	}